

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O0

void quantize_3(float *src,char *dst,int n,int k)

{
  int in_ECX;
  int in_EDX;
  int j;
  int in_stack_00000044;
  void *in_stack_00000048;
  float *in_stack_00000050;
  int k_00;
  
  if (in_ECX % 0x40 == 0) {
    for (k_00 = 0; k_00 < in_EDX; k_00 = k_00 + 1) {
      quantize_3_row(in_stack_00000050,in_stack_00000048,in_stack_00000044);
      quantize_3_row_size(k_00);
    }
    return;
  }
  __assert_fail("k % QK == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                ,0x357,"void quantize_3(const float *restrict, char *restrict, int, int)");
}

Assistant:

void quantize_3(const float * restrict src, char * restrict dst, int n, int k) {
    assert(k % QK == 0);

    for (int j = 0; j < n; j++) {
        quantize_3_row(src + j*k, dst, k);
        dst = (char *) dst + quantize_3_row_size(k);
    }
}